

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_ManSaveCuts(Of_Man_t *p,Of_Cut_t **pCuts,int nCuts)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *Entry;
  int *piVar4;
  int local_34;
  int local_30;
  int nCutsNew;
  int nInts;
  int iCur;
  int *pPlace;
  int i;
  int nCuts_local;
  Of_Cut_t **pCuts_local;
  Of_Man_t *p_local;
  
  local_30 = 1;
  local_34 = 0;
  for (pPlace._0_4_ = 0; (int)pPlace < nCuts; pPlace._0_4_ = (int)pPlace + 1) {
    local_30 = (*(uint *)&pCuts[(int)pPlace]->field_0x10 >> 0x1b) + 4 + local_30;
    local_34 = local_34 + 1;
  }
  if (0xffff < (int)((p->iCur & 0xffffU) + local_30)) {
    p->iCur = ((p->iCur >> 0x10) + 1) * 0x10000;
  }
  iVar2 = Vec_PtrSize(&p->vPages);
  if (iVar2 == p->iCur >> 0x10) {
    Entry = calloc(0x10000,4);
    Vec_PtrPush(&p->vPages,Entry);
  }
  iVar2 = p->iCur;
  p->iCur = local_30 + p->iCur;
  piVar4 = Of_ManCutSet(p,iVar2);
  _nInts = piVar4 + 1;
  *piVar4 = local_34;
  for (pPlace._0_4_ = 0; (int)pPlace < nCuts; pPlace._0_4_ = (int)pPlace + 1) {
    iVar3 = Of_CutSetBoth(*(uint *)&pCuts[(int)pPlace]->field_0x10 >> 0x1b,
                          *(uint *)&pCuts[(int)pPlace]->field_0x10 & 0x7ffffff);
    piVar4 = _nInts + 1;
    *_nInts = iVar3;
    memcpy(piVar4,pCuts[(int)pPlace]->pLeaves,
           (ulong)(*(uint *)&pCuts[(int)pPlace]->field_0x10 >> 0x1b) << 2);
    uVar1 = *(uint *)&pCuts[(int)pPlace]->field_0x10;
    memset(piVar4 + (int)(uVar1 >> 0x1b),0xff,0xc);
    _nInts = piVar4 + (int)(uVar1 >> 0x1b) + 3;
  }
  return iVar2;
}

Assistant:

static inline int Of_ManSaveCuts( Of_Man_t * p, Of_Cut_t ** pCuts, int nCuts )
{
    int i, * pPlace, iCur, nInts = 1, nCutsNew = 0;
    for ( i = 0; i < nCuts; i++ )
        nInts += pCuts[i]->nLeaves + OF_CUT_EXTRA, nCutsNew++;
    if ( (p->iCur & 0xFFFF) + nInts > 0xFFFF )
        p->iCur = ((p->iCur >> 16) + 1) << 16;
    if ( Vec_PtrSize(&p->vPages) == (p->iCur >> 16) )
        Vec_PtrPush( &p->vPages, ABC_CALLOC(int, (1<<16)) );
    iCur = p->iCur; p->iCur += nInts;
    pPlace = Of_ManCutSet( p, iCur );
    *pPlace++ = nCutsNew;
    for ( i = 0; i < nCuts; i++ )
    {
        *pPlace++ = Of_CutSetBoth( pCuts[i]->nLeaves, pCuts[i]->iFunc );
        memcpy( pPlace, pCuts[i]->pLeaves, sizeof(int) * pCuts[i]->nLeaves );
        pPlace += pCuts[i]->nLeaves;
        memset( pPlace, 0xFF, sizeof(int) * (OF_CUT_EXTRA - 1) );
        pPlace += OF_CUT_EXTRA - 1;
    }
    return iCur;
}